

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScene::removeItem(QGraphicsScene *this,QGraphicsItem *item)

{
  long lVar1;
  QMessageLogger *pQVar2;
  QGraphicsScene *pQVar3;
  QGraphicsScenePrivate *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QGraphicsScene *in_stack_00000008;
  QGraphicsScene *targetScene;
  QGraphicsScenePrivate *d;
  QGraphicsItem *in_stack_000000b8;
  QVariant newSceneVariant;
  char *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  int line;
  QGraphicsScenePrivate *this_00;
  QGraphicsScene **in_stack_ffffffffffffff18;
  char local_a8 [32];
  char local_88 [32];
  QVariant local_68;
  QVariant local_48;
  undefined8 this_01;
  
  line = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QGraphicsScene *)0x9c4565);
  if (in_RSI == (QGraphicsScenePrivate *)0x0) {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)in_stack_ffffffffffffff18,line,in_stack_ffffffffffffff08);
    QMessageLogger::warning(local_88,"QGraphicsScene::removeItem: cannot remove 0-item");
  }
  else {
    pQVar2 = (QMessageLogger *)QGraphicsItem::scene((QGraphicsItem *)0x9c45a7);
    if (pQVar2 == in_RDI) {
      this_01 = &DAT_aaaaaaaaaaaaaaaa;
      this_00 = in_RSI;
      ::QVariant::fromValue<QGraphicsScene_*,_true>(in_stack_ffffffffffffff18);
      (**(code **)(*(long *)this_00 + 0x108))(&stack0xffffffffffffffd8,this_00,0xb,&local_48);
      ::QVariant::~QVariant(&local_48);
      pQVar2 = (QMessageLogger *)qvariant_cast<QGraphicsScene*>((QVariant *)this_00);
      if ((pQVar2 == (QMessageLogger *)0x0) || (pQVar2 == in_RDI)) {
        QGraphicsScenePrivate::removeItemHelper((QGraphicsScenePrivate *)this_01,in_stack_000000b8);
        (**(code **)(*(long *)in_RSI + 0x108))(&local_68,in_RSI,0x10,&stack0xffffffffffffffd8);
        ::QVariant::~QVariant(&local_68);
        QGraphicsScenePrivate::updateInputMethodSensitivityInViews(this_00);
      }
      else {
        addItem(in_stack_00000008,in_stack_000000b8);
      }
      ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffffd8);
    }
    else {
      QMessageLogger::QMessageLogger
                (in_RDI,(char *)in_stack_ffffffffffffff18,line,in_stack_ffffffffffffff08);
      pQVar3 = QGraphicsItem::scene((QGraphicsItem *)0x9c45d8);
      QMessageLogger::warning
                (local_a8,
                 "QGraphicsScene::removeItem: item %p\'s scene (%p) is different from this scene (%p)"
                 ,in_RSI,pQVar3,in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::removeItem(QGraphicsItem *item)
{
    // ### Refactoring: This function shares much functionality with _q_removeItemLater()
    Q_D(QGraphicsScene);
    if (!item) {
        qWarning("QGraphicsScene::removeItem: cannot remove 0-item");
        return;
    }
    if (item->scene() != this) {
        qWarning("QGraphicsScene::removeItem: item %p's scene (%p)"
                 " is different from this scene (%p)",
                 item, item->scene(), this);
        return;
    }

    // Notify the item that it's scene is changing to 0, allowing the item to
    // react.
    const QVariant newSceneVariant(item->itemChange(QGraphicsItem::ItemSceneChange,
                                                    QVariant::fromValue<QGraphicsScene *>(0)));
    QGraphicsScene *targetScene = qvariant_cast<QGraphicsScene *>(newSceneVariant);
    if (targetScene != nullptr && targetScene != this) {
        targetScene->addItem(item);
        return;
    }

    d->removeItemHelper(item);

    // Deliver post-change notification
    item->itemChange(QGraphicsItem::ItemSceneHasChanged, newSceneVariant);

    d->updateInputMethodSensitivityInViews();
}